

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  uint8_t type;
  long lVar1;
  int iVar2;
  roaring64_bitmap_t *art;
  art_val_t *paVar3;
  int *c;
  art_val_t *paVar4;
  container_t *pcVar5;
  int *piVar6;
  ulong uVar7;
  uint8_t uVar8;
  ulong uVar9;
  art_iterator_t *iterator;
  bool bVar10;
  art_iterator_t it1;
  art_iterator_t it2;
  art_iterator_t aStack_138;
  art_iterator_t local_b0;
  
  art = (roaring64_bitmap_t *)roaring_malloc(0x10);
  (art->art).root = (art_node_t *)0x0;
  art->flags = '\0';
  art_init_iterator(&aStack_138,&r1->art,true);
  art_init_iterator(&local_b0,&r2->art,true);
  paVar4 = local_b0.value;
joined_r0x00107e96:
  if (aStack_138.value == (art_val_t *)0x0) {
    return art;
  }
  iVar2 = 0;
  local_b0.value = paVar4;
  if ((paVar4 != (art_val_t *)0x0) &&
     (iVar2 = art_compare_keys(aStack_138.key,local_b0.key), iVar2 == 0)) {
    paVar3 = (art_val_t *)roaring_malloc(0x10);
    c = (int *)container_andnot(*(container_t **)(aStack_138.value[1].key + 2),
                                aStack_138.value[1].key[0],
                                *(container_t **)(local_b0.value[1].key + 2),
                                local_b0.value[1].key[0],paVar3[1].key);
    *(int **)(paVar3[1].key + 2) = c;
    type = paVar3[1].key[0];
    piVar6 = c;
    uVar8 = type;
    if (type == '\x04') {
      uVar8 = (uint8_t)c[2];
      piVar6 = *(int **)c;
    }
    iVar2 = *piVar6;
    if ((uVar8 == '\x03') || (uVar8 == '\x02')) {
      bVar10 = 0 < iVar2;
    }
    else {
      if (iVar2 == -1) {
        if (**(long **)(piVar6 + 2) == 0) {
          uVar7 = 0xffffffffffffffff;
          do {
            if (uVar7 == 0x3fe) {
              uVar9 = 0x3ff;
              break;
            }
            uVar9 = uVar7 + 1;
            lVar1 = uVar7 + 2;
            uVar7 = uVar9;
          } while ((*(long **)(piVar6 + 2))[lVar1] == 0);
          bVar10 = 0x3fe < uVar9;
        }
        else {
          bVar10 = false;
        }
      }
      else {
        bVar10 = iVar2 == 0;
      }
      bVar10 = (bool)(bVar10 ^ 1);
    }
    if (bVar10) {
      art_insert((art_t *)art,aStack_138.key,paVar3);
    }
    else {
      container_free(c,type);
      roaring_free(paVar3);
    }
    art_iterator_next(&aStack_138);
    art_iterator_next(&local_b0);
    iVar2 = 0;
  }
  paVar3 = aStack_138.value;
  if (paVar4 != (art_val_t *)0x0 && -1 < iVar2) goto LAB_00108004;
  paVar4 = (art_val_t *)roaring_malloc(0x10);
  paVar4[1].key[0] = paVar3[1].key[0];
  pcVar5 = get_copy_of_container(*(container_t **)(paVar3[1].key + 2),paVar4[1].key,false);
  *(container_t **)(paVar4[1].key + 2) = pcVar5;
  art_insert((art_t *)art,aStack_138.key,paVar4);
  iterator = &aStack_138;
  goto LAB_0010800b;
LAB_00108004:
  iterator = &local_b0;
  paVar4 = local_b0.value;
  if (0 < iVar2) {
LAB_0010800b:
    art_iterator_next(iterator);
    paVar4 = local_b0.value;
  }
  goto joined_r0x00107e96;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                result_leaf->container = container_andnot(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);

                if (container_nonzero_cardinality(result_leaf->container,
                                                  result_leaf->typecode)) {
                    art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                } else {
                    container_free(result_leaf->container,
                                   result_leaf->typecode);
                    free_leaf(result_leaf);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}